

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  undefined4 extraout_var_00;
  EpsCopyOutputStream out;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  undefined2 local_28;
  byte local_26;
  ulong value;
  
  iVar1 = (*this->_vptr_MessageLite[8])();
  value = CONCAT44(extraout_var,iVar1);
  if ((value & 0xffffffff80000000) == 0) {
    if ((long)value <= (long)size) {
      local_26 = io::CodedOutputStream::default_serialization_deterministic_ & 1;
      local_60.filename_ = (char *)0x0;
      local_60.message_.field_2._8_8_ = 0;
      local_28 = 0;
      local_60._0_8_ = value + (long)data;
      iVar1 = (*this->_vptr_MessageLite[0xb])(this,data);
      if (value + (long)data != CONCAT44(extraout_var_00,iVar1)) {
        internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
                   ,0x161);
        pLVar2 = internal::LogMessage::operator<<(&local_98,"CHECK failed: target + size == res: ");
        internal::LogFinisher::operator=(&local_99,pLVar2);
        internal::LogMessage::~LogMessage(&local_98);
      }
      return true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x1e0);
    (*this->_vptr_MessageLite[2])(&local_98,this);
    pLVar2 = internal::LogMessage::operator<<(&local_60,(string *)&local_98);
    pLVar2 = internal::LogMessage::operator<<(pLVar2," exceeded maximum protobuf size of 2GB: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    internal::LogFinisher::operator=(&local_99,pLVar2);
    if (local_98._0_8_ != (long)&local_98 + 0x10U) {
      operator_delete((void *)local_98._0_8_);
    }
    internal::LogMessage::~LogMessage(&local_60);
  }
  return false;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  const size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }
  if (size < static_cast<int64_t>(byte_size)) return false;
  uint8_t* start = reinterpret_cast<uint8_t*>(data);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}